

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_printf.h
# Opt level: O0

int stbsp__real_to_parts(longlong *bits,int *expo,double value)

{
  int iVar1;
  int local_34;
  ulong uStack_30;
  int cn;
  longlong b;
  double d;
  double value_local;
  int *expo_local;
  longlong *bits_local;
  
  uStack_30 = 0;
  b = (longlong)value;
  for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
    *(undefined1 *)((long)&stack0xffffffffffffffd0 + (long)local_34) =
         *(undefined1 *)((long)&b + (long)local_34);
  }
  *bits = uStack_30 & 0xfffffffffffff;
  iVar1 = (int)(uStack_30 >> 0x20);
  *expo = (iVar1 >> 0x14 & 0x7ffU) - 0x3ff;
  return iVar1 >> 0x1f;
}

Assistant:

static stbsp__int32 stbsp__real_to_parts(stbsp__int64 *bits, stbsp__int32 *expo, double value)
{
   double d;
   stbsp__int64 b = 0;

   // load value and round at the frac_digits
   d = value;

   STBSP__COPYFP(b, d);

   *bits = b & ((((stbsp__uint64)1) << 52) - 1);
   *expo = (stbsp__int32)(((b >> 52) & 2047) - 1023);

   return (stbsp__int32)(b >> 63);
}